

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall
Graph::insertEdge(Graph *this,int originID,int destinyID,int id,double resist,double react,bool swit
                 )

{
  Edge *this_00;
  Vertex *pVVar1;
  Vertex *pVVar2;
  
  pVVar1 = this->verticesList;
  for (pVVar2 = pVVar1; pVVar2 != (Vertex *)0x0; pVVar2 = pVVar2->nextVertex) {
    if (pVVar2->id == originID) goto LAB_00102ab1;
  }
  pVVar2 = (Vertex *)0x0;
LAB_00102ab1:
  do {
    if (pVVar1 == (Vertex *)0x0) {
      pVVar1 = (Vertex *)0x0;
LAB_00102ac6:
      this_00 = (Edge *)operator_new(0x60);
      Edge::Edge(this_00,id);
      this_00->destiny = pVVar1;
      this_00->origin = pVVar2;
      this_00->nextEdge = pVVar2->edgesList;
      pVVar2->edgesList = this_00;
      this_00->resistance = resist;
      this_00->reactance = react;
      this_00->closed = swit;
      pVVar2->outdegree = pVVar2->outdegree + 1;
      pVVar1->indegree = pVVar1->indegree + 1;
      this->edgesSize = this->edgesSize + 1;
      return;
    }
    if (pVVar1->id == destinyID) goto LAB_00102ac6;
    pVVar1 = pVVar1->nextVertex;
  } while( true );
}

Assistant:

void Graph::insertEdge(int originID, int destinyID, int id, double resist, double react, bool swit){
    Vertex *originVertex = findVertex(originID);
    Vertex *destinyVertex = findVertex(destinyID);
    Edge *newEdge = new Edge(id);
    newEdge->setDestiny(destinyVertex);
    newEdge->setOrigin(originVertex);

    // Insere Arco no inicio da lista
    newEdge->setNext(originVertex->getEdgesList());
    originVertex->setEdgesList(newEdge);
    newEdge->setResistance(resist);
    newEdge->setReactance(react);
    newEdge->setSwitch(swit);

    originVertex->setOutdegree(originVertex->getIndegree() + 1);
    destinyVertex->setIndegree(destinyVertex->getOutdegree() + 1);

    this->edgesSize++;
}